

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# time.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_time_timestamp_primitive_microsecondsNow
          (sysbvm_context_t *context,sysbvm_tuple_t closure,size_t argumentCount,
          sysbvm_tuple_t *arguments)

{
  long value;
  sysbvm_tuple_t sVar1;
  timespec ts;
  timespec local_28;
  
  if (argumentCount != 0) {
    sysbvm_error_argumentCountMismatch(0,argumentCount);
  }
  local_28.tv_sec = 0;
  local_28.tv_nsec = 0;
  clock_gettime(1,&local_28);
  value = local_28.tv_nsec / 1000 + local_28.tv_sec * 1000000;
  if (value + 0x800000000000000U >> 0x3c == 0) {
    sVar1 = value * 0x10 | 0xc;
  }
  else {
    sVar1 = sysbvm_tuple_int64_encodeBig(context,value);
  }
  return sVar1;
}

Assistant:

static sysbvm_tuple_t sysbvm_time_timestamp_primitive_microsecondsNow(sysbvm_context_t *context, sysbvm_tuple_t closure, size_t argumentCount, sysbvm_tuple_t *arguments)
{
    (void)context;
    (void)closure;
    (void)arguments;
    if(argumentCount != 0) sysbvm_error_argumentCountMismatch(0, argumentCount);

    return sysbvm_tuple_int64_encode(context, sysbvm_time_microsecondsTimestamp());
}